

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::VulkanMemoryConfig::Serialize(VulkanMemoryConfig *this,Message *msg)

{
  uint8_t *src_begin;
  ulong uVar1;
  
  uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  if ((uVar1 & 2) != 0) {
    protozero::Message::AppendTinyVarInt(msg,1,(uint)this->track_driver_memory_usage_);
    uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar1 & 4) != 0) {
    protozero::Message::AppendTinyVarInt(msg,2,(uint)this->track_device_memory_usage_);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void VulkanMemoryConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: track_driver_memory_usage
  if (_has_field_[1]) {
    msg->AppendTinyVarInt(1, track_driver_memory_usage_);
  }

  // Field 2: track_device_memory_usage
  if (_has_field_[2]) {
    msg->AppendTinyVarInt(2, track_device_memory_usage_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}